

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineLayoutVk.cpp
# Opt level: O0

void __thiscall Diligent::PipelineLayoutVk::~PipelineLayoutVk(PipelineLayoutVk *this)

{
  VkPipelineLayout_T *pVVar1;
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  PipelineLayoutVk *this_local;
  
  msg.field_2._8_8_ = this;
  pVVar1 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkPipelineLayout_T_
                     ((VulkanObjectWrapper *)this);
  if (pVVar1 != (VkPipelineLayout_T *)0x0) {
    FormatString<char[40]>
              ((string *)local_30,(char (*) [40])"Pipeline layout have not been released!");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"~PipelineLayoutVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x33);
    std::__cxx11::string::~string((string *)local_30);
  }
  VulkanUtilities::
  VulkanObjectWrapper<VkPipelineLayout_T_*,_(VulkanUtilities::VulkanHandleTypeId)11>::
  ~VulkanObjectWrapper(&this->m_VkPipelineLayout);
  return;
}

Assistant:

PipelineLayoutVk::~PipelineLayoutVk()
{
    VERIFY(!m_VkPipelineLayout, "Pipeline layout have not been released!");
}